

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O1

void __thiscall QWidgetWindow::handleResizeEvent(QWidgetWindow *this,QResizeEvent *event)

{
  long lVar1;
  Data *pDVar2;
  bool bVar3;
  QObject *pQVar4;
  long in_FS_OFFSET;
  QRegion dirtyRegion;
  QRect local_40;
  QRegion local_30;
  QRect local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)((this->m_widget).wp.value + 0x20);
  local_28.x2.m_i = *(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14);
  local_28.y2.m_i = *(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18);
  local_28.x1.m_i = 0;
  local_28.y1.m_i = 0;
  bVar3 = updateSize(this);
  if (bVar3) {
    pDVar2 = (this->m_widget).wp.d;
    if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
      pQVar4 = (QObject *)0x0;
    }
    else {
      pQVar4 = (this->m_widget).wp.value;
    }
    QCoreApplication::forwardEvent(pQVar4,(QEvent *)event,(QEvent *)0x0);
    bVar3 = QWidgetPrivate::shouldPaintOnScreen(*(QWidgetPrivate **)((this->m_widget).wp.value + 8))
    ;
    if (!bVar3) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QWidgetPrivate::syncBackingStore(*(QWidgetPrivate **)((this->m_widget).wp.value + 8));
        return;
      }
      goto LAB_00323ec4;
    }
    local_30.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    lVar1 = *(long *)((this->m_widget).wp.value + 0x20);
    local_40.x2.m_i = *(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14);
    local_40.y2.m_i = *(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18);
    local_40.x1.m_i = 0;
    local_40.y1.m_i = 0;
    QRegion::QRegion(&local_30,&local_40,Rectangle);
    if ((*(byte *)(*(long *)((this->m_widget).wp.value + 0x20) + 8) & 0x20) != 0) {
      QRegion::QRegion((QRegion *)&local_40,&local_28,Rectangle);
      QRegion::operator-=(&local_30,(QRegion *)&local_40);
      QRegion::~QRegion((QRegion *)&local_40);
    }
    QWidgetPrivate::syncBackingStore(*(QWidgetPrivate **)((this->m_widget).wp.value + 8),&local_30);
    QRegion::~QRegion(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_00323ec4:
  __stack_chk_fail();
}

Assistant:

void QWidgetWindow::handleResizeEvent(QResizeEvent *event)
{
    auto oldRect = m_widget->rect();

    if (updateSize()) {
        QGuiApplication::forwardEvent(m_widget, event);

        if (m_widget->d_func()->shouldPaintOnScreen()) {
            QRegion dirtyRegion = m_widget->rect();
            if (m_widget->testAttribute(Qt::WA_StaticContents))
                dirtyRegion -= oldRect;
            m_widget->d_func()->syncBackingStore(dirtyRegion);
        } else {
            m_widget->d_func()->syncBackingStore();
        }
    }
}